

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_increase_exp(command_conflict *cmd)

{
  wchar_t wVar1;
  wchar_t local_14;
  command_conflict *pcStack_10;
  wchar_t n;
  command_conflict *cmd_local;
  
  pcStack_10 = cmd;
  wVar1 = cmd_get_arg_number((command *)cmd,"quantity",&local_14);
  if (wVar1 != L'\0') {
    local_14 = get_quantity("Gain how much experience? ",L'✏');
    cmd_set_arg_number((command *)pcStack_10,"quantity",local_14);
  }
  if (local_14 < L'\x01') {
    local_14 = L'\x01';
  }
  player_exp_gain(player,local_14);
  return;
}

Assistant:

void do_cmd_wiz_increase_exp(struct command *cmd)
{
	int n;

	if (cmd_get_arg_number(cmd, "quantity", &n) != CMD_OK) {
		n = get_quantity("Gain how much experience? ", 9999);
		cmd_set_arg_number(cmd, "quantity", n);
	}

	if (n < 1) n = 1;
	player_exp_gain(player, n);
}